

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void i_number_suite::i_number_very_big_negative_int(void)

{
  error *ex;
  undefined4 local_1ac;
  value local_1a8 [2];
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  undefined1 local_190 [8];
  reader reader;
  char input [50];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x333236343733322d;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a0,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_190,&local_1a0);
  local_1a8[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_190);
  local_1ac = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x77,"void i_number_suite::i_number_very_big_negative_int()",local_1a8,&local_1ac);
  _ex = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_190);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[50]>
            ("reader.literal()","\"-237462374673276894279832749832423479823246327846\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x78,"void i_number_suite::i_number_very_big_negative_int()",&ex,
             "-237462374673276894279832749832423479823246327846");
  trial::protocol::json::basic_reader<char>::value<long_long>((basic_reader<char> *)local_190);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<long long int>()","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x7c,"void i_number_suite::i_number_very_big_negative_int()");
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_190);
  return;
}

Assistant:

void i_number_very_big_negative_int()
{
    const char input[] = "-237462374673276894279832749832423479823246327846";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "-237462374673276894279832749832423479823246327846");
    // Cannot be represented by integers
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<long long int>(),
                                    json::error,
                                    "invalid value");
}